

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O0

int zt_mem_pool_destroy(zt_mem_pool **pool)

{
  zt_mem_page *pzVar1;
  long *in_RDI;
  zt_mem_page *page;
  zt_elist_t *ptmp;
  zt_elist_t *tmp;
  zt_mem_page *local_20;
  zt_mem_page *page_00;
  
  pzVar1 = (zt_mem_page *)((*(zt_mem_page **)(*in_RDI + 0x88))->page_list).next;
  page_00 = *(zt_mem_page **)(*in_RDI + 0x88);
  while( true ) {
    local_20 = pzVar1;
    if (page_00 == (zt_mem_page *)(*in_RDI + 0x80)) {
      zt_elist_remove((zt_elist_t *)0x15160f);
      (*GLOBAL_zmt.dealloc)(*(void **)(*in_RDI + 0x10));
      *(undefined8 *)(*in_RDI + 0x10) = 0;
      (*GLOBAL_zmt.dealloc)((void *)*in_RDI);
      *in_RDI = 0;
      return 0;
    }
    if (page_00->num_free_elts < *(ulong *)(*in_RDI + 0x40)) break;
    zt_mem_page_destroy(page_00);
    pzVar1 = (zt_mem_page *)(local_20->page_list).next;
    page_00 = local_20;
  }
  return -1;
}

Assistant:

int
zt_mem_pool_destroy(zt_mem_pool **pool)
{
    zt_elist_t  * tmp;
    zt_elist_t  * ptmp;
    zt_mem_page * page;

    zt_elist_for_each_safe(&(*pool)->page_list, tmp, ptmp) {
        page = zt_elist_data(tmp, zt_mem_page, page_list);

        /* sanity checking */
        if (page->num_free_elts < (*pool)->elts_per_page) {
            return -1;
        } else {
            zt_mem_page_destroy(page);
        }
    }

    zt_elist_remove(&(*pool)->pool_list);

    GLOBAL_zmt.dealloc((*pool)->name);
    (*pool)->name = NULL;

    GLOBAL_zmt.dealloc((*pool));
    *pool = NULL;

    return 0;
}